

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void iadst16_stage6_ssse3(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  uint uVar51;
  int iVar52;
  char in_DL;
  long in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i cospi_m48_p16;
  __m128i cospi_p48_m16;
  __m128i cospi_p16_p48;
  undefined2 local_868;
  undefined2 uStack_866;
  undefined2 uStack_864;
  undefined2 uStack_862;
  undefined2 local_858;
  undefined2 uStack_856;
  undefined2 uStack_854;
  undefined2 uStack_852;
  undefined2 local_848;
  undefined2 uStack_846;
  undefined2 uStack_844;
  undefined2 uStack_842;
  undefined2 local_838;
  undefined2 uStack_836;
  undefined2 uStack_834;
  undefined2 uStack_832;
  undefined2 local_828;
  undefined2 uStack_826;
  undefined2 uStack_824;
  undefined2 uStack_822;
  undefined2 local_818;
  undefined2 uStack_816;
  undefined2 uStack_814;
  undefined2 uStack_812;
  undefined2 local_808;
  undefined2 uStack_806;
  undefined2 uStack_804;
  undefined2 uStack_802;
  undefined2 local_7f8;
  undefined2 uStack_7f6;
  undefined2 uStack_7f4;
  undefined2 uStack_7f2;
  undefined2 uStack_7e0;
  undefined2 uStack_7de;
  undefined2 uStack_7dc;
  undefined2 uStack_7da;
  undefined2 uStack_7d0;
  undefined2 uStack_7ce;
  undefined2 uStack_7cc;
  undefined2 uStack_7ca;
  undefined2 uStack_7c0;
  undefined2 uStack_7be;
  undefined2 uStack_7bc;
  undefined2 uStack_7ba;
  undefined2 uStack_7b0;
  undefined2 uStack_7ae;
  undefined2 uStack_7ac;
  undefined2 uStack_7aa;
  undefined2 uStack_7a0;
  undefined2 uStack_79e;
  undefined2 uStack_79c;
  undefined2 uStack_79a;
  undefined2 uStack_790;
  undefined2 uStack_78e;
  undefined2 uStack_78c;
  undefined2 uStack_78a;
  undefined2 uStack_780;
  undefined2 uStack_77e;
  undefined2 uStack_77c;
  undefined2 uStack_77a;
  undefined2 uStack_770;
  undefined2 uStack_76e;
  undefined2 uStack_76c;
  undefined2 uStack_76a;
  undefined4 local_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 local_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 local_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 local_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined4 local_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 local_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined4 local_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 local_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 local_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 local_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 local_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 local_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 local_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 local_388;
  undefined4 uStack_384;
  undefined4 uStack_380;
  undefined4 uStack_37c;
  undefined4 local_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  
  uVar51 = (uint)*(ushort *)(in_RSI + 0x40) | *(int *)(in_RSI + 0xc0) << 0x10;
  uVar45 = CONCAT44(uVar51,uVar51);
  uVar46 = CONCAT44(uVar51,uVar51);
  iVar52 = (uint)*(ushort *)(in_RSI + 0xc0) + *(int *)(in_RSI + 0x40) * -0x10000;
  uVar47 = CONCAT44(iVar52,iVar52);
  uVar48 = CONCAT44(iVar52,iVar52);
  uVar51 = -*(int *)(in_RSI + 0xc0) & 0xffffU | *(int *)(in_RSI + 0x40) << 0x10;
  uVar49 = CONCAT44(uVar51,uVar51);
  uVar50 = CONCAT44(uVar51,uVar51);
  uVar1 = *(undefined8 *)(in_RDI + 0x40);
  uVar2 = *(undefined8 *)(in_RDI + 0x50);
  local_7f8 = (undefined2)uVar1;
  uStack_7f6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_7f4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_7f2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_808 = (undefined2)uVar2;
  uStack_806 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_804 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_802 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x48);
  uVar2 = *(undefined8 *)(in_RDI + 0x58);
  uStack_770 = (undefined2)uVar1;
  uStack_76e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_76c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_76a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_780 = (undefined2)uVar2;
  uStack_77e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_77c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_77a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar28._2_2_ = local_808;
  auVar28._0_2_ = local_7f8;
  auVar28._4_2_ = uStack_7f6;
  auVar28._6_2_ = uStack_806;
  auVar28._10_2_ = uStack_804;
  auVar28._8_2_ = uStack_7f4;
  auVar28._12_2_ = uStack_7f2;
  auVar28._14_2_ = uStack_802;
  auVar27._8_8_ = uVar46;
  auVar27._0_8_ = uVar45;
  auVar53 = pmaddwd(auVar28,auVar27);
  auVar26._2_2_ = uStack_780;
  auVar26._0_2_ = uStack_770;
  auVar26._4_2_ = uStack_76e;
  auVar26._6_2_ = uStack_77e;
  auVar26._10_2_ = uStack_77c;
  auVar26._8_2_ = uStack_76c;
  auVar26._12_2_ = uStack_76a;
  auVar26._14_2_ = uStack_77a;
  auVar25._8_8_ = uVar46;
  auVar25._0_8_ = uVar45;
  auVar54 = pmaddwd(auVar26,auVar25);
  auVar24._2_2_ = local_808;
  auVar24._0_2_ = local_7f8;
  auVar24._4_2_ = uStack_7f6;
  auVar24._6_2_ = uStack_806;
  auVar24._10_2_ = uStack_804;
  auVar24._8_2_ = uStack_7f4;
  auVar24._12_2_ = uStack_7f2;
  auVar24._14_2_ = uStack_802;
  auVar23._8_8_ = uVar48;
  auVar23._0_8_ = uVar47;
  auVar55 = pmaddwd(auVar24,auVar23);
  auVar22._2_2_ = uStack_780;
  auVar22._0_2_ = uStack_770;
  auVar22._4_2_ = uStack_76e;
  auVar22._6_2_ = uStack_77e;
  auVar22._10_2_ = uStack_77c;
  auVar22._8_2_ = uStack_76c;
  auVar22._12_2_ = uStack_76a;
  auVar22._14_2_ = uStack_77a;
  auVar21._8_8_ = uVar48;
  auVar21._0_8_ = uVar47;
  auVar56 = pmaddwd(auVar22,auVar21);
  local_378 = auVar53._0_4_;
  uStack_374 = auVar53._4_4_;
  uStack_370 = auVar53._8_4_;
  uStack_36c = auVar53._12_4_;
  local_388 = (int)in_XMM0_Qa;
  uStack_384 = (int)((ulong)in_XMM0_Qa >> 0x20);
  uStack_380 = (int)in_XMM0_Qb;
  uStack_37c = (int)((ulong)in_XMM0_Qb >> 0x20);
  local_398 = auVar54._0_4_;
  uStack_394 = auVar54._4_4_;
  uStack_390 = auVar54._8_4_;
  uStack_38c = auVar54._12_4_;
  local_3b8 = auVar55._0_4_;
  uStack_3b4 = auVar55._4_4_;
  uStack_3b0 = auVar55._8_4_;
  uStack_3ac = auVar55._12_4_;
  local_3d8 = auVar56._0_4_;
  uStack_3d4 = auVar56._4_4_;
  uStack_3d0 = auVar56._8_4_;
  uStack_3cc = auVar56._12_4_;
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar55 = ZEXT416((uint)(int)in_DL);
  auVar56 = ZEXT416((uint)(int)in_DL);
  auVar44._4_4_ = uStack_374 + uStack_384 >> auVar53;
  auVar44._0_4_ = local_378 + local_388 >> auVar53;
  auVar44._12_4_ = uStack_36c + uStack_37c >> auVar53;
  auVar44._8_4_ = uStack_370 + uStack_380 >> auVar53;
  auVar43._4_4_ = uStack_394 + uStack_384 >> auVar54;
  auVar43._0_4_ = local_398 + local_388 >> auVar54;
  auVar43._12_4_ = uStack_38c + uStack_37c >> auVar54;
  auVar43._8_4_ = uStack_390 + uStack_380 >> auVar54;
  auVar53 = packssdw(auVar44,auVar43);
  *(undefined1 (*) [16])(in_RDI + 0x40) = auVar53;
  auVar42._4_4_ = uStack_3b4 + uStack_384 >> auVar55;
  auVar42._0_4_ = local_3b8 + local_388 >> auVar55;
  auVar42._12_4_ = uStack_3ac + uStack_37c >> auVar55;
  auVar42._8_4_ = uStack_3b0 + uStack_380 >> auVar55;
  auVar41._4_4_ = uStack_3d4 + uStack_384 >> auVar56;
  auVar41._0_4_ = local_3d8 + local_388 >> auVar56;
  auVar41._12_4_ = uStack_3cc + uStack_37c >> auVar56;
  auVar41._8_4_ = uStack_3d0 + uStack_380 >> auVar56;
  auVar53 = packssdw(auVar42,auVar41);
  *(undefined1 (*) [16])(in_RDI + 0x50) = auVar53;
  uVar1 = *(undefined8 *)(in_RDI + 0x60);
  uVar2 = *(undefined8 *)(in_RDI + 0x70);
  local_818 = (undefined2)uVar1;
  uStack_816 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_814 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_812 = (undefined2)((ulong)uVar1 >> 0x30);
  local_828 = (undefined2)uVar2;
  uStack_826 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_824 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_822 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x68);
  uVar2 = *(undefined8 *)(in_RDI + 0x78);
  uStack_790 = (undefined2)uVar1;
  uStack_78e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_78c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_78a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_7a0 = (undefined2)uVar2;
  uStack_79e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_79c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_79a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar20._2_2_ = local_828;
  auVar20._0_2_ = local_818;
  auVar20._4_2_ = uStack_816;
  auVar20._6_2_ = uStack_826;
  auVar20._10_2_ = uStack_824;
  auVar20._8_2_ = uStack_814;
  auVar20._12_2_ = uStack_812;
  auVar20._14_2_ = uStack_822;
  auVar19._8_8_ = uVar50;
  auVar19._0_8_ = uVar49;
  auVar53 = pmaddwd(auVar20,auVar19);
  auVar18._2_2_ = uStack_7a0;
  auVar18._0_2_ = uStack_790;
  auVar18._4_2_ = uStack_78e;
  auVar18._6_2_ = uStack_79e;
  auVar18._10_2_ = uStack_79c;
  auVar18._8_2_ = uStack_78c;
  auVar18._12_2_ = uStack_78a;
  auVar18._14_2_ = uStack_79a;
  auVar17._8_8_ = uVar50;
  auVar17._0_8_ = uVar49;
  auVar54 = pmaddwd(auVar18,auVar17);
  auVar16._2_2_ = local_828;
  auVar16._0_2_ = local_818;
  auVar16._4_2_ = uStack_816;
  auVar16._6_2_ = uStack_826;
  auVar16._10_2_ = uStack_824;
  auVar16._8_2_ = uStack_814;
  auVar16._12_2_ = uStack_812;
  auVar16._14_2_ = uStack_822;
  auVar15._8_8_ = uVar46;
  auVar15._0_8_ = uVar45;
  auVar55 = pmaddwd(auVar16,auVar15);
  auVar14._2_2_ = uStack_7a0;
  auVar14._0_2_ = uStack_790;
  auVar14._4_2_ = uStack_78e;
  auVar14._6_2_ = uStack_79e;
  auVar14._10_2_ = uStack_79c;
  auVar14._8_2_ = uStack_78c;
  auVar14._12_2_ = uStack_78a;
  auVar14._14_2_ = uStack_79a;
  auVar13._8_8_ = uVar46;
  auVar13._0_8_ = uVar45;
  auVar56 = pmaddwd(auVar14,auVar13);
  local_3f8 = auVar53._0_4_;
  uStack_3f4 = auVar53._4_4_;
  uStack_3f0 = auVar53._8_4_;
  uStack_3ec = auVar53._12_4_;
  local_418 = auVar54._0_4_;
  uStack_414 = auVar54._4_4_;
  uStack_410 = auVar54._8_4_;
  uStack_40c = auVar54._12_4_;
  local_438 = auVar55._0_4_;
  uStack_434 = auVar55._4_4_;
  uStack_430 = auVar55._8_4_;
  uStack_42c = auVar55._12_4_;
  local_458 = auVar56._0_4_;
  uStack_454 = auVar56._4_4_;
  uStack_450 = auVar56._8_4_;
  uStack_44c = auVar56._12_4_;
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar55 = ZEXT416((uint)(int)in_DL);
  auVar56 = ZEXT416((uint)(int)in_DL);
  auVar40._4_4_ = uStack_3f4 + uStack_384 >> auVar53;
  auVar40._0_4_ = local_3f8 + local_388 >> auVar53;
  auVar40._12_4_ = uStack_3ec + uStack_37c >> auVar53;
  auVar40._8_4_ = uStack_3f0 + uStack_380 >> auVar53;
  auVar39._4_4_ = uStack_414 + uStack_384 >> auVar54;
  auVar39._0_4_ = local_418 + local_388 >> auVar54;
  auVar39._12_4_ = uStack_40c + uStack_37c >> auVar54;
  auVar39._8_4_ = uStack_410 + uStack_380 >> auVar54;
  auVar53 = packssdw(auVar40,auVar39);
  *(undefined1 (*) [16])(in_RDI + 0x60) = auVar53;
  auVar38._4_4_ = uStack_434 + uStack_384 >> auVar55;
  auVar38._0_4_ = local_438 + local_388 >> auVar55;
  auVar38._12_4_ = uStack_42c + uStack_37c >> auVar55;
  auVar38._8_4_ = uStack_430 + uStack_380 >> auVar55;
  auVar37._4_4_ = uStack_454 + uStack_384 >> auVar56;
  auVar37._0_4_ = local_458 + local_388 >> auVar56;
  auVar37._12_4_ = uStack_44c + uStack_37c >> auVar56;
  auVar37._8_4_ = uStack_450 + uStack_380 >> auVar56;
  auVar53 = packssdw(auVar38,auVar37);
  *(undefined1 (*) [16])(in_RDI + 0x70) = auVar53;
  uVar1 = *(undefined8 *)(in_RDI + 0xc0);
  uVar2 = *(undefined8 *)(in_RDI + 0xd0);
  local_838 = (undefined2)uVar1;
  uStack_836 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_834 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_832 = (undefined2)((ulong)uVar1 >> 0x30);
  local_848 = (undefined2)uVar2;
  uStack_846 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_844 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_842 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 200);
  uVar2 = *(undefined8 *)(in_RDI + 0xd8);
  uStack_7b0 = (undefined2)uVar1;
  uStack_7ae = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_7ac = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_7aa = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_7c0 = (undefined2)uVar2;
  uStack_7be = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_7bc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_7ba = (undefined2)((ulong)uVar2 >> 0x30);
  auVar12._2_2_ = local_848;
  auVar12._0_2_ = local_838;
  auVar12._4_2_ = uStack_836;
  auVar12._6_2_ = uStack_846;
  auVar12._10_2_ = uStack_844;
  auVar12._8_2_ = uStack_834;
  auVar12._12_2_ = uStack_832;
  auVar12._14_2_ = uStack_842;
  auVar11._8_8_ = uVar46;
  auVar11._0_8_ = uVar45;
  auVar53 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = uStack_7c0;
  auVar10._0_2_ = uStack_7b0;
  auVar10._4_2_ = uStack_7ae;
  auVar10._6_2_ = uStack_7be;
  auVar10._10_2_ = uStack_7bc;
  auVar10._8_2_ = uStack_7ac;
  auVar10._12_2_ = uStack_7aa;
  auVar10._14_2_ = uStack_7ba;
  auVar9._8_8_ = uVar46;
  auVar9._0_8_ = uVar45;
  auVar54 = pmaddwd(auVar10,auVar9);
  auVar8._2_2_ = local_848;
  auVar8._0_2_ = local_838;
  auVar8._4_2_ = uStack_836;
  auVar8._6_2_ = uStack_846;
  auVar8._10_2_ = uStack_844;
  auVar8._8_2_ = uStack_834;
  auVar8._12_2_ = uStack_832;
  auVar8._14_2_ = uStack_842;
  auVar7._8_8_ = uVar48;
  auVar7._0_8_ = uVar47;
  auVar55 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = uStack_7c0;
  auVar6._0_2_ = uStack_7b0;
  auVar6._4_2_ = uStack_7ae;
  auVar6._6_2_ = uStack_7be;
  auVar6._10_2_ = uStack_7bc;
  auVar6._8_2_ = uStack_7ac;
  auVar6._12_2_ = uStack_7aa;
  auVar6._14_2_ = uStack_7ba;
  auVar5._8_8_ = uVar48;
  auVar5._0_8_ = uVar47;
  auVar56 = pmaddwd(auVar6,auVar5);
  local_478 = auVar53._0_4_;
  uStack_474 = auVar53._4_4_;
  uStack_470 = auVar53._8_4_;
  uStack_46c = auVar53._12_4_;
  local_498 = auVar54._0_4_;
  uStack_494 = auVar54._4_4_;
  uStack_490 = auVar54._8_4_;
  uStack_48c = auVar54._12_4_;
  local_4b8 = auVar55._0_4_;
  uStack_4b4 = auVar55._4_4_;
  uStack_4b0 = auVar55._8_4_;
  uStack_4ac = auVar55._12_4_;
  local_4d8 = auVar56._0_4_;
  uStack_4d4 = auVar56._4_4_;
  uStack_4d0 = auVar56._8_4_;
  uStack_4cc = auVar56._12_4_;
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar55 = ZEXT416((uint)(int)in_DL);
  auVar56 = ZEXT416((uint)(int)in_DL);
  auVar36._4_4_ = uStack_474 + uStack_384 >> auVar53;
  auVar36._0_4_ = local_478 + local_388 >> auVar53;
  auVar36._12_4_ = uStack_46c + uStack_37c >> auVar53;
  auVar36._8_4_ = uStack_470 + uStack_380 >> auVar53;
  auVar35._4_4_ = uStack_494 + uStack_384 >> auVar54;
  auVar35._0_4_ = local_498 + local_388 >> auVar54;
  auVar35._12_4_ = uStack_48c + uStack_37c >> auVar54;
  auVar35._8_4_ = uStack_490 + uStack_380 >> auVar54;
  auVar53 = packssdw(auVar36,auVar35);
  *(undefined1 (*) [16])(in_RDI + 0xc0) = auVar53;
  auVar34._4_4_ = uStack_4b4 + uStack_384 >> auVar55;
  auVar34._0_4_ = local_4b8 + local_388 >> auVar55;
  auVar34._12_4_ = uStack_4ac + uStack_37c >> auVar55;
  auVar34._8_4_ = uStack_4b0 + uStack_380 >> auVar55;
  auVar33._4_4_ = uStack_4d4 + uStack_384 >> auVar56;
  auVar33._0_4_ = local_4d8 + local_388 >> auVar56;
  auVar33._12_4_ = uStack_4cc + uStack_37c >> auVar56;
  auVar33._8_4_ = uStack_4d0 + uStack_380 >> auVar56;
  auVar53 = packssdw(auVar34,auVar33);
  *(undefined1 (*) [16])(in_RDI + 0xd0) = auVar53;
  uVar1 = *(undefined8 *)(in_RDI + 0xe0);
  uVar2 = *(undefined8 *)(in_RDI + 0xf0);
  local_858 = (undefined2)uVar1;
  uStack_856 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_854 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_852 = (undefined2)((ulong)uVar1 >> 0x30);
  local_868 = (undefined2)uVar2;
  uStack_866 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_864 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_862 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0xe8);
  uVar2 = *(undefined8 *)(in_RDI + 0xf8);
  uStack_7d0 = (undefined2)uVar1;
  uStack_7ce = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_7cc = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_7ca = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_7e0 = (undefined2)uVar2;
  uStack_7de = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_7dc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_7da = (undefined2)((ulong)uVar2 >> 0x30);
  auVar4._2_2_ = local_868;
  auVar4._0_2_ = local_858;
  auVar4._4_2_ = uStack_856;
  auVar4._6_2_ = uStack_866;
  auVar4._10_2_ = uStack_864;
  auVar4._8_2_ = uStack_854;
  auVar4._12_2_ = uStack_852;
  auVar4._14_2_ = uStack_862;
  auVar57._8_8_ = uVar50;
  auVar57._0_8_ = uVar49;
  auVar57 = pmaddwd(auVar4,auVar57);
  auVar3._2_2_ = uStack_7e0;
  auVar3._0_2_ = uStack_7d0;
  auVar3._4_2_ = uStack_7ce;
  auVar3._6_2_ = uStack_7de;
  auVar3._10_2_ = uStack_7dc;
  auVar3._8_2_ = uStack_7cc;
  auVar3._12_2_ = uStack_7ca;
  auVar3._14_2_ = uStack_7da;
  auVar58._8_8_ = uVar50;
  auVar58._0_8_ = uVar49;
  auVar58 = pmaddwd(auVar3,auVar58);
  auVar56._2_2_ = local_868;
  auVar56._0_2_ = local_858;
  auVar56._4_2_ = uStack_856;
  auVar56._6_2_ = uStack_866;
  auVar56._10_2_ = uStack_864;
  auVar56._8_2_ = uStack_854;
  auVar56._12_2_ = uStack_852;
  auVar56._14_2_ = uStack_862;
  auVar55._8_8_ = uVar46;
  auVar55._0_8_ = uVar45;
  auVar55 = pmaddwd(auVar56,auVar55);
  auVar54._2_2_ = uStack_7e0;
  auVar54._0_2_ = uStack_7d0;
  auVar54._4_2_ = uStack_7ce;
  auVar54._6_2_ = uStack_7de;
  auVar54._10_2_ = uStack_7dc;
  auVar54._8_2_ = uStack_7cc;
  auVar54._12_2_ = uStack_7ca;
  auVar54._14_2_ = uStack_7da;
  auVar53._8_8_ = uVar46;
  auVar53._0_8_ = uVar45;
  auVar53 = pmaddwd(auVar54,auVar53);
  local_4f8 = auVar57._0_4_;
  uStack_4f4 = auVar57._4_4_;
  uStack_4f0 = auVar57._8_4_;
  uStack_4ec = auVar57._12_4_;
  local_518 = auVar58._0_4_;
  uStack_514 = auVar58._4_4_;
  uStack_510 = auVar58._8_4_;
  uStack_50c = auVar58._12_4_;
  local_538 = auVar55._0_4_;
  uStack_534 = auVar55._4_4_;
  uStack_530 = auVar55._8_4_;
  uStack_52c = auVar55._12_4_;
  local_558 = auVar53._0_4_;
  uStack_554 = auVar53._4_4_;
  uStack_550 = auVar53._8_4_;
  uStack_54c = auVar53._12_4_;
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar55 = ZEXT416((uint)(int)in_DL);
  auVar56 = ZEXT416((uint)(int)in_DL);
  auVar32._4_4_ = uStack_4f4 + uStack_384 >> auVar53;
  auVar32._0_4_ = local_4f8 + local_388 >> auVar53;
  auVar32._12_4_ = uStack_4ec + uStack_37c >> auVar53;
  auVar32._8_4_ = uStack_4f0 + uStack_380 >> auVar53;
  auVar31._4_4_ = uStack_514 + uStack_384 >> auVar54;
  auVar31._0_4_ = local_518 + local_388 >> auVar54;
  auVar31._12_4_ = uStack_50c + uStack_37c >> auVar54;
  auVar31._8_4_ = uStack_510 + uStack_380 >> auVar54;
  auVar53 = packssdw(auVar32,auVar31);
  *(undefined1 (*) [16])(in_RDI + 0xe0) = auVar53;
  auVar30._4_4_ = uStack_534 + uStack_384 >> auVar55;
  auVar30._0_4_ = local_538 + local_388 >> auVar55;
  auVar30._12_4_ = uStack_52c + uStack_37c >> auVar55;
  auVar30._8_4_ = uStack_530 + uStack_380 >> auVar55;
  auVar29._4_4_ = uStack_554 + uStack_384 >> auVar56;
  auVar29._0_4_ = local_558 + local_388 >> auVar56;
  auVar29._12_4_ = uStack_54c + uStack_37c >> auVar56;
  auVar29._8_4_ = uStack_550 + uStack_380 >> auVar56;
  auVar53 = packssdw(auVar30,auVar29);
  *(undefined1 (*) [16])(in_RDI + 0xf0) = auVar53;
  return;
}

Assistant:

static inline void iadst16_stage6_ssse3(__m128i *x, const int32_t *cospi,
                                        const __m128i __rounding,
                                        int8_t cos_bit) {
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_m48_p16 = pair_set_epi16(-cospi[48], cospi[16]);
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x[4], x[5], x[4], x[5]);
  btf_16_sse2(cospi_m48_p16, cospi_p16_p48, x[6], x[7], x[6], x[7]);
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x[12], x[13], x[12], x[13]);
  btf_16_sse2(cospi_m48_p16, cospi_p16_p48, x[14], x[15], x[14], x[15]);
}